

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O2

void psh_globals_set_scale
               (PSH_Globals globals,FT_Fixed x_scale,FT_Fixed y_scale,FT_Fixed x_delta,
               FT_Fixed y_delta)

{
  PSH_BluesRec *pPVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  PSH_BluesRec *pPVar7;
  PSH_Blue_ZoneRec *pPVar8;
  int iVar9;
  FT_UInt FVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  FT_Pos *pFVar14;
  int iVar15;
  bool bVar16;
  
  if ((globals->dimension[0].scale_mult != x_scale) ||
     (globals->dimension[0].scale_delta != x_delta)) {
    globals->dimension[0].scale_mult = x_scale;
    globals->dimension[0].scale_delta = x_delta;
    psh_globals_scale_widths(globals,0);
  }
  if ((globals->dimension[1].scale_mult == y_scale) &&
     (globals->dimension[1].scale_delta == y_delta)) {
    return;
  }
  globals->dimension[1].scale_mult = y_scale;
  globals->dimension[1].scale_delta = y_delta;
  psh_globals_scale_widths(globals,1);
  if (y_scale < 0x20c49ba) {
    bVar16 = y_scale * 0x7d < (globals->blues).blue_scale * 8;
  }
  else {
    bVar16 = y_scale < ((globals->blues).blue_scale << 3) / 0x7d;
  }
  pPVar1 = &globals->blues;
  (globals->blues).no_overshoots = bVar16;
  uVar6 = (globals->blues).blue_shift;
  lVar2 = (long)(int)y_scale;
  uVar3 = (int)uVar6 >> 0x1f & uVar6;
  while ((uVar4 = uVar3, 0 < (int)uVar6 &&
         (uVar4 = uVar6,
         0x20 < (int)((ulong)uVar6 * lVar2 + ((long)((ulong)uVar6 * lVar2) >> 0x3f) + 0x8000 >> 0x10
                     )))) {
    uVar6 = uVar6 - 1;
  }
  (globals->blues).blue_threshold = uVar4;
  iVar9 = 0;
  do {
    pPVar7 = pPVar1;
    switch(iVar9) {
    case 0:
      break;
    case 1:
      pPVar7 = (PSH_BluesRec *)&(globals->blues).normal_bottom;
      break;
    case 2:
      pPVar7 = (PSH_BluesRec *)&(globals->blues).family_top;
      break;
    default:
      pPVar7 = (PSH_BluesRec *)&(globals->blues).family_bottom;
      break;
    case 4:
      iVar9 = 0;
      do {
        if (iVar9 == 2) {
          return;
        }
        pPVar7 = (PSH_BluesRec *)&(globals->blues).normal_bottom;
        if (iVar9 == 0) {
          pPVar7 = pPVar1;
        }
        lVar12 = 0x918;
        if (iVar9 == 0) {
          lVar12 = 0x610;
        }
        FVar10 = (pPVar7->normal_top).count;
        pPVar8 = (pPVar7->normal_top).zones;
        while (bVar16 = FVar10 != 0, FVar10 = FVar10 - 1, bVar16) {
          iVar15 = *(int *)((long)(pPVar1->normal_top).zones + lVar12 + -8);
          pFVar14 = (FT_Pos *)((long)&(globals->blues).normal_top.zones[0].cur_top + lVar12);
          while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
            iVar5 = pPVar8->org_ref - (int)pFVar14[-5];
            iVar11 = -iVar5;
            if (0 < iVar5) {
              iVar11 = iVar5;
            }
            if ((int)((ulong)(iVar11 * lVar2 + (iVar11 * lVar2 >> 0x3f) + 0x8000) >> 0x10) < 0x40) {
              pPVar8->cur_top = *pFVar14;
              pPVar8->cur_bottom = pFVar14[-1];
              pPVar8->cur_ref = pFVar14[-3];
              pPVar8->cur_delta = pFVar14[-2];
              break;
            }
            pFVar14 = pFVar14 + 6;
          }
          pPVar8 = pPVar8 + 1;
        }
        iVar9 = iVar9 + 1;
      } while( true );
    }
    FVar10 = (pPVar7->normal_top).count;
    pPVar8 = (pPVar7->normal_top).zones;
    while (bVar16 = FVar10 != 0, FVar10 = FVar10 - 1, bVar16) {
      lVar12 = pPVar8->org_top * lVar2;
      pPVar8->cur_top = (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10) + y_delta;
      lVar12 = pPVar8->org_bottom * lVar2;
      pPVar8->cur_bottom = (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10) + y_delta;
      lVar12 = pPVar8->org_ref * lVar2;
      lVar13 = pPVar8->org_delta * lVar2;
      pPVar8->cur_delta = (long)(int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10);
      pPVar8->cur_ref =
           (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10) + y_delta + 0x20 &
           0xffffffffffffffc0;
      pPVar8 = pPVar8 + 1;
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( void )
  psh_globals_set_scale( PSH_Globals  globals,
                         FT_Fixed     x_scale,
                         FT_Fixed     y_scale,
                         FT_Fixed     x_delta,
                         FT_Fixed     y_delta )
  {
    PSH_Dimension  dim;


    dim = &globals->dimension[0];
    if ( x_scale != dim->scale_mult  ||
         x_delta != dim->scale_delta )
    {
      dim->scale_mult  = x_scale;
      dim->scale_delta = x_delta;

      psh_globals_scale_widths( globals, 0 );
    }

    dim = &globals->dimension[1];
    if ( y_scale != dim->scale_mult  ||
         y_delta != dim->scale_delta )
    {
      dim->scale_mult  = y_scale;
      dim->scale_delta = y_delta;

      psh_globals_scale_widths( globals, 1 );
      psh_blues_scale_zones( &globals->blues, y_scale, y_delta );
    }
  }